

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr.cc
# Opt level: O2

void __thiscall
gimage::HighDynamicRangeFusionBase::mulWeight
          (HighDynamicRangeFusionBase *this,ImageFloat *target,ImageFloat *weight)

{
  float *pfVar1;
  float fVar2;
  int iVar3;
  long lVar4;
  float ***pppfVar5;
  long lVar6;
  float ***pppfVar7;
  long lVar8;
  float *pfVar9;
  float *pfVar10;
  
  iVar3 = target->depth;
  lVar4 = target->height;
  pppfVar5 = target->img;
  lVar6 = target->width;
  pppfVar7 = weight->img;
  for (lVar8 = 0; lVar8 < iVar3; lVar8 = lVar8 + 1) {
    pfVar9 = *pppfVar5[lVar8];
    pfVar1 = pfVar9 + lVar4 * lVar6;
    pfVar10 = **pppfVar7;
    for (; pfVar9 < pfVar1; pfVar9 = pfVar9 + 1) {
      fVar2 = *pfVar10;
      pfVar10 = pfVar10 + 1;
      *pfVar9 = fVar2 * *pfVar9;
    }
  }
  return;
}

Assistant:

void HighDynamicRangeFusionBase::mulWeight(ImageFloat &target, ImageFloat &weight)
{
  for (int d=0; d<target.getDepth(); d++)
  {
    float *p=target.getPtr(0, 0, d);
    float *pn=p+target.getWidth()*target.getHeight();
    float *w=weight.getPtr(0, 0, 0);

    while (p < pn)
    {
      *p++ *= *w++;
    }
  }
}